

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ConversionFuncs.cpp
# Opt level: O0

void __thiscall slang::ast::builtins::ItoRFunction::ItoRFunction(ItoRFunction *this)

{
  undefined8 *in_RDI;
  SubroutineKind in_stack_00000028;
  KnownSystemName in_stack_0000002c;
  SystemSubroutine *in_stack_00000030;
  
  SystemSubroutine::SystemSubroutine(in_stack_00000030,in_stack_0000002c,in_stack_00000028);
  *in_RDI = &PTR__ItoRFunction_01a2a4b0;
  return;
}

Assistant:

ItoRFunction() : SystemSubroutine(KnownSystemName::Itor, SubroutineKind::Function) {}